

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmd128.c
# Opt level: O3

int rmd128_compress(hash_state *md,uchar *buf)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong32 uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  ulong32 __ROLc_tmp_65;
  ulong32 __ROLc_tmp_67;
  ulong32 __ROLc_tmp_1;
  ulong32 __ROLc_tmp_64;
  uint uVar21;
  ulong32 __ROLc_tmp;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  ulong32 __ROLc_tmp_3;
  uint uVar25;
  ulong32 __ROLc_tmp_2;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  
  uVar1 = (md->rmd128).state[2];
  uVar2 = (md->rmd128).state[1];
  iVar3 = *(int *)buf;
  uVar4 = (md->rmd128).state[0];
  uVar5 = (md->rmd128).state[3];
  iVar6 = *(int *)(buf + 4);
  iVar7 = *(int *)(buf + 8);
  iVar8 = *(int *)(buf + 0xc);
  iVar9 = *(int *)(buf + 0x28);
  uVar22 = (uVar1 ^ uVar2 ^ uVar5) + uVar4 + iVar3;
  iVar10 = *(int *)(buf + 0x10);
  uVar23 = uVar22 * 0x800 | uVar22 >> 0x15;
  iVar11 = *(int *)(buf + 0x34);
  uVar22 = (uVar1 ^ uVar2 ^ uVar23) + iVar6 + uVar5;
  uVar22 = uVar22 * 0x4000 | uVar22 >> 0x12;
  uVar26 = (uVar23 ^ uVar2 ^ uVar22) + iVar7 + uVar1;
  uVar27 = uVar26 * 0x8000 | uVar26 >> 0x11;
  iVar12 = *(int *)(buf + 0x18);
  iVar13 = *(int *)(buf + 0x30);
  uVar26 = (uVar22 ^ uVar23 ^ uVar27) + iVar8 + uVar2;
  uVar26 = uVar26 * 0x1000 | uVar26 >> 0x14;
  iVar14 = *(int *)(buf + 0x14);
  uVar23 = uVar23 + iVar10 + (uVar27 ^ uVar22 ^ uVar26);
  uVar23 = uVar23 * 0x20 | uVar23 >> 0x1b;
  iVar15 = *(int *)(buf + 0x1c);
  uVar22 = uVar22 + iVar14 + (uVar26 ^ uVar27 ^ uVar23);
  uVar22 = uVar22 * 0x100 | uVar22 >> 0x18;
  uVar27 = uVar27 + iVar12 + (uVar23 ^ uVar26 ^ uVar22);
  uVar27 = uVar27 * 0x80 | uVar27 >> 0x19;
  iVar16 = *(int *)(buf + 0x20);
  uVar26 = uVar26 + iVar15 + (uVar22 ^ uVar23 ^ uVar27);
  uVar26 = uVar26 * 0x200 | uVar26 >> 0x17;
  iVar17 = *(int *)(buf + 0x24);
  uVar23 = uVar23 + iVar16 + (uVar27 ^ uVar22 ^ uVar26);
  uVar23 = uVar23 * 0x800 | uVar23 >> 0x15;
  iVar18 = *(int *)(buf + 0x2c);
  uVar22 = uVar22 + iVar17 + (uVar26 ^ uVar27 ^ uVar23);
  uVar22 = uVar22 * 0x2000 | uVar22 >> 0x13;
  uVar27 = uVar27 + iVar9 + (uVar23 ^ uVar26 ^ uVar22);
  uVar27 = uVar27 * 0x4000 | uVar27 >> 0x12;
  iVar19 = *(int *)(buf + 0x38);
  uVar26 = uVar26 + iVar18 + (uVar22 ^ uVar23 ^ uVar27);
  uVar26 = uVar26 * 0x8000 | uVar26 >> 0x11;
  uVar23 = uVar23 + iVar13 + (uVar27 ^ uVar22 ^ uVar26);
  uVar23 = uVar23 * 0x40 | uVar23 >> 0x1a;
  iVar20 = *(int *)(buf + 0x3c);
  uVar22 = uVar22 + iVar11 + (uVar26 ^ uVar27 ^ uVar23);
  uVar22 = uVar22 * 0x80 | uVar22 >> 0x19;
  uVar27 = uVar27 + iVar19 + (uVar23 ^ uVar26 ^ uVar22);
  uVar27 = uVar27 * 0x200 | uVar27 >> 0x17;
  uVar26 = uVar26 + iVar20 + (uVar22 ^ uVar23 ^ uVar27);
  uVar26 = uVar26 * 0x100 | uVar26 >> 0x18;
  uVar23 = uVar23 + iVar15 + 0x5a827999 + (~uVar26 & uVar22 | uVar26 & uVar27);
  uVar23 = uVar23 * 0x80 | uVar23 >> 0x19;
  uVar22 = uVar22 + iVar10 + 0x5a827999 + (~uVar23 & uVar27 | uVar23 & uVar26);
  uVar22 = uVar22 * 0x40 | uVar22 >> 0x1a;
  uVar27 = uVar27 + iVar11 + 0x5a827999 + (~uVar22 & uVar26 | uVar22 & uVar23);
  uVar27 = uVar27 * 0x100 | uVar27 >> 0x18;
  uVar26 = uVar26 + iVar6 + 0x5a827999 + (~uVar27 & uVar23 | uVar27 & uVar22);
  uVar26 = uVar26 * 0x2000 | uVar26 >> 0x13;
  uVar23 = uVar23 + iVar9 + 0x5a827999 + (~uVar26 & uVar22 | uVar26 & uVar27);
  uVar23 = uVar23 * 0x800 | uVar23 >> 0x15;
  uVar22 = uVar22 + iVar12 + 0x5a827999 + (~uVar23 & uVar27 | uVar23 & uVar26);
  uVar22 = uVar22 * 0x200 | uVar22 >> 0x17;
  uVar27 = uVar27 + iVar20 + 0x5a827999 + (~uVar22 & uVar26 | uVar22 & uVar23);
  uVar27 = uVar27 * 0x80 | uVar27 >> 0x19;
  uVar26 = uVar26 + iVar8 + 0x5a827999 + (~uVar27 & uVar23 | uVar27 & uVar22);
  uVar26 = uVar26 * 0x8000 | uVar26 >> 0x11;
  uVar23 = uVar23 + iVar13 + 0x5a827999 + (~uVar26 & uVar22 | uVar26 & uVar27);
  uVar23 = uVar23 * 0x80 | uVar23 >> 0x19;
  uVar22 = uVar22 + iVar3 + 0x5a827999 + (~uVar23 & uVar27 | uVar23 & uVar26);
  uVar22 = uVar22 * 0x1000 | uVar22 >> 0x14;
  uVar27 = uVar27 + iVar17 + 0x5a827999 + (~uVar22 & uVar26 | uVar22 & uVar23);
  uVar27 = uVar27 * 0x8000 | uVar27 >> 0x11;
  uVar26 = uVar26 + iVar14 + 0x5a827999 + (~uVar27 & uVar23 | uVar27 & uVar22);
  uVar26 = uVar26 * 0x200 | uVar26 >> 0x17;
  uVar23 = uVar23 + iVar7 + 0x5a827999 + (~uVar26 & uVar22 | uVar26 & uVar27);
  uVar23 = uVar23 * 0x800 | uVar23 >> 0x15;
  uVar22 = uVar22 + iVar19 + 0x5a827999 + (~uVar23 & uVar27 | uVar23 & uVar26);
  uVar22 = uVar22 * 0x80 | uVar22 >> 0x19;
  uVar27 = uVar27 + iVar18 + 0x5a827999 + (~uVar22 & uVar26 | uVar22 & uVar23);
  uVar27 = uVar27 * 0x2000 | uVar27 >> 0x13;
  uVar26 = uVar26 + iVar16 + 0x5a827999 + (~uVar27 & uVar23 | uVar27 & uVar22);
  uVar26 = uVar26 * 0x1000 | uVar26 >> 0x14;
  uVar23 = uVar23 + iVar8 + 0x6ed9eba1 + ((~uVar27 | uVar26) ^ uVar22);
  uVar23 = uVar23 * 0x800 | uVar23 >> 0x15;
  uVar22 = uVar22 + iVar9 + 0x6ed9eba1 + ((~uVar26 | uVar23) ^ uVar27);
  uVar22 = uVar22 * 0x2000 | uVar22 >> 0x13;
  uVar27 = uVar27 + iVar19 + 0x6ed9eba1 + ((~uVar23 | uVar22) ^ uVar26);
  uVar27 = uVar27 * 0x40 | uVar27 >> 0x1a;
  uVar26 = uVar26 + iVar10 + 0x6ed9eba1 + ((~uVar22 | uVar27) ^ uVar23);
  uVar26 = uVar26 * 0x80 | uVar26 >> 0x19;
  uVar23 = uVar23 + iVar17 + 0x6ed9eba1 + ((~uVar27 | uVar26) ^ uVar22);
  uVar23 = uVar23 * 0x4000 | uVar23 >> 0x12;
  uVar22 = uVar22 + iVar20 + 0x6ed9eba1 + ((~uVar26 | uVar23) ^ uVar27);
  uVar22 = uVar22 * 0x200 | uVar22 >> 0x17;
  uVar27 = uVar27 + iVar16 + 0x6ed9eba1 + ((~uVar23 | uVar22) ^ uVar26);
  uVar27 = uVar27 * 0x2000 | uVar27 >> 0x13;
  uVar26 = uVar26 + iVar6 + 0x6ed9eba1 + ((~uVar22 | uVar27) ^ uVar23);
  uVar26 = uVar26 * 0x8000 | uVar26 >> 0x11;
  uVar23 = uVar23 + iVar7 + 0x6ed9eba1 + ((~uVar27 | uVar26) ^ uVar22);
  uVar23 = uVar23 * 0x4000 | uVar23 >> 0x12;
  uVar22 = uVar22 + iVar15 + 0x6ed9eba1 + ((~uVar26 | uVar23) ^ uVar27);
  uVar22 = uVar22 * 0x100 | uVar22 >> 0x18;
  uVar27 = uVar27 + iVar3 + 0x6ed9eba1 + ((~uVar23 | uVar22) ^ uVar26);
  uVar27 = uVar27 * 0x2000 | uVar27 >> 0x13;
  uVar26 = uVar26 + iVar12 + 0x6ed9eba1 + ((~uVar22 | uVar27) ^ uVar23);
  uVar26 = uVar26 * 0x40 | uVar26 >> 0x1a;
  uVar23 = uVar23 + iVar11 + 0x6ed9eba1 + ((~uVar27 | uVar26) ^ uVar22);
  uVar23 = uVar23 * 0x20 | uVar23 >> 0x1b;
  uVar22 = uVar22 + iVar18 + 0x6ed9eba1 + ((~uVar26 | uVar23) ^ uVar27);
  uVar22 = uVar22 * 0x1000 | uVar22 >> 0x14;
  uVar27 = uVar27 + iVar14 + 0x6ed9eba1 + ((~uVar23 | uVar22) ^ uVar26);
  uVar27 = uVar27 * 0x80 | uVar27 >> 0x19;
  uVar26 = uVar26 + iVar13 + 0x6ed9eba1 + ((~uVar22 | uVar27) ^ uVar23);
  uVar26 = uVar26 * 0x20 | uVar26 >> 0x1b;
  uVar23 = uVar23 + iVar6 + -0x70e44324 + (~uVar22 & uVar27 | uVar26 & uVar22);
  uVar23 = uVar23 * 0x800 | uVar23 >> 0x15;
  uVar22 = uVar22 + iVar17 + -0x70e44324 + (~uVar27 & uVar26 | uVar23 & uVar27);
  uVar22 = uVar22 * 0x1000 | uVar22 >> 0x14;
  uVar27 = uVar27 + iVar18 + -0x70e44324 + (~uVar26 & uVar23 | uVar22 & uVar26);
  uVar27 = uVar27 * 0x4000 | uVar27 >> 0x12;
  uVar26 = uVar26 + iVar9 + -0x70e44324 + (~uVar23 & uVar22 | uVar27 & uVar23);
  uVar26 = uVar26 * 0x8000 | uVar26 >> 0x11;
  uVar23 = uVar23 + iVar3 + -0x70e44324 + (~uVar22 & uVar27 | uVar26 & uVar22);
  uVar23 = uVar23 * 0x4000 | uVar23 >> 0x12;
  uVar22 = uVar22 + iVar16 + -0x70e44324 + (~uVar27 & uVar26 | uVar23 & uVar27);
  uVar22 = uVar22 * 0x8000 | uVar22 >> 0x11;
  uVar27 = uVar27 + iVar13 + -0x70e44324 + (~uVar26 & uVar23 | uVar22 & uVar26);
  uVar27 = uVar27 * 0x200 | uVar27 >> 0x17;
  uVar26 = uVar26 + iVar10 + -0x70e44324 + (~uVar23 & uVar22 | uVar27 & uVar23);
  uVar26 = uVar26 * 0x100 | uVar26 >> 0x18;
  uVar23 = uVar23 + iVar11 + -0x70e44324 + (~uVar22 & uVar27 | uVar26 & uVar22);
  uVar23 = uVar23 * 0x200 | uVar23 >> 0x17;
  uVar22 = uVar22 + iVar8 + -0x70e44324 + (~uVar27 & uVar26 | uVar23 & uVar27);
  uVar22 = uVar22 * 0x4000 | uVar22 >> 0x12;
  uVar27 = uVar27 + iVar15 + -0x70e44324 + (~uVar26 & uVar23 | uVar22 & uVar26);
  uVar28 = uVar27 * 0x20 | uVar27 >> 0x1b;
  uVar26 = uVar26 + iVar20 + -0x70e44324 + (~uVar23 & uVar22 | uVar28 & uVar23);
  uVar26 = uVar26 * 0x40 | uVar26 >> 0x1a;
  uVar23 = uVar23 + iVar19 + -0x70e44324 + (~uVar22 & uVar28 | uVar26 & uVar22);
  uVar24 = uVar23 * 0x100 | uVar23 >> 0x18;
  uVar22 = uVar22 + iVar14 + -0x70e44324 + (~uVar28 & uVar26 | uVar24 & uVar28);
  uVar27 = uVar22 * 0x40 | uVar22 >> 0x1a;
  uVar22 = uVar28 + iVar12 + -0x70e44324 + (~uVar26 & uVar24 | uVar27 & uVar26);
  uVar29 = uVar22 * 0x20 | uVar22 >> 0x1b;
  uVar25 = uVar26 + iVar7 + -0x70e44324 + (~uVar24 & uVar27 | uVar29 & uVar24);
  uVar22 = uVar4 + iVar14 + 0x50a28be6 + (~uVar5 & uVar1 | uVar5 & uVar2);
  uVar28 = uVar22 * 0x100 | uVar22 >> 0x18;
  uVar22 = uVar5 + iVar19 + 0x50a28be6 + (~uVar1 & uVar2 | uVar28 & uVar1);
  uVar22 = uVar22 * 0x200 | uVar22 >> 0x17;
  uVar23 = uVar1 + iVar15 + 0x50a28be6 + (~uVar2 & uVar28 | uVar22 & uVar2);
  uVar26 = uVar23 * 0x200 | uVar23 >> 0x17;
  uVar23 = iVar3 + uVar2 + 0x50a28be6 + (~uVar28 & uVar22 | uVar26 & uVar28);
  uVar23 = uVar23 * 0x800 | uVar23 >> 0x15;
  uVar28 = uVar28 + iVar17 + 0x50a28be6 + (~uVar22 & uVar26 | uVar23 & uVar22);
  uVar28 = uVar28 * 0x2000 | uVar28 >> 0x13;
  uVar22 = uVar22 + iVar7 + 0x50a28be6 + (~uVar26 & uVar23 | uVar28 & uVar26);
  uVar22 = uVar22 * 0x8000 | uVar22 >> 0x11;
  uVar26 = uVar26 + iVar18 + 0x50a28be6 + (~uVar23 & uVar28 | uVar22 & uVar23);
  uVar26 = uVar26 * 0x8000 | uVar26 >> 0x11;
  uVar23 = uVar23 + iVar10 + 0x50a28be6 + (~uVar28 & uVar22 | uVar26 & uVar28);
  uVar23 = uVar23 * 0x20 | uVar23 >> 0x1b;
  uVar28 = uVar28 + iVar11 + 0x50a28be6 + (~uVar22 & uVar26 | uVar23 & uVar22);
  uVar28 = uVar28 * 0x80 | uVar28 >> 0x19;
  uVar22 = uVar22 + iVar12 + 0x50a28be6 + (~uVar26 & uVar23 | uVar28 & uVar26);
  uVar22 = uVar22 * 0x80 | uVar22 >> 0x19;
  uVar26 = uVar26 + iVar20 + 0x50a28be6 + (~uVar23 & uVar28 | uVar22 & uVar23);
  uVar26 = uVar26 * 0x100 | uVar26 >> 0x18;
  uVar23 = uVar23 + iVar16 + 0x50a28be6 + (~uVar28 & uVar22 | uVar26 & uVar28);
  uVar23 = uVar23 * 0x800 | uVar23 >> 0x15;
  uVar28 = uVar28 + iVar6 + 0x50a28be6 + (~uVar22 & uVar26 | uVar23 & uVar22);
  uVar28 = uVar28 * 0x4000 | uVar28 >> 0x12;
  uVar22 = uVar22 + iVar9 + 0x50a28be6 + (~uVar26 & uVar23 | uVar28 & uVar26);
  uVar22 = uVar22 * 0x4000 | uVar22 >> 0x12;
  uVar26 = uVar26 + iVar8 + 0x50a28be6 + (~uVar23 & uVar28 | uVar22 & uVar23);
  uVar26 = uVar26 * 0x1000 | uVar26 >> 0x14;
  uVar23 = uVar23 + iVar13 + 0x50a28be6 + (~uVar28 & uVar22 | uVar26 & uVar28);
  uVar23 = uVar23 * 0x40 | uVar23 >> 0x1a;
  uVar28 = uVar28 + iVar12 + 0x5c4dd124 + ((~uVar26 | uVar23) ^ uVar22);
  uVar28 = uVar28 * 0x200 | uVar28 >> 0x17;
  uVar22 = uVar22 + iVar18 + 0x5c4dd124 + ((~uVar23 | uVar28) ^ uVar26);
  uVar22 = uVar22 * 0x2000 | uVar22 >> 0x13;
  uVar26 = uVar26 + iVar8 + 0x5c4dd124 + ((~uVar28 | uVar22) ^ uVar23);
  uVar26 = uVar26 * 0x8000 | uVar26 >> 0x11;
  uVar23 = uVar23 + iVar15 + 0x5c4dd124 + ((~uVar22 | uVar26) ^ uVar28);
  uVar23 = uVar23 * 0x80 | uVar23 >> 0x19;
  uVar28 = uVar28 + iVar3 + 0x5c4dd124 + ((~uVar26 | uVar23) ^ uVar22);
  uVar28 = uVar28 * 0x1000 | uVar28 >> 0x14;
  uVar22 = uVar22 + iVar11 + 0x5c4dd124 + ((~uVar23 | uVar28) ^ uVar26);
  uVar22 = uVar22 * 0x100 | uVar22 >> 0x18;
  uVar26 = uVar26 + iVar14 + 0x5c4dd124 + ((~uVar28 | uVar22) ^ uVar23);
  uVar26 = uVar26 * 0x200 | uVar26 >> 0x17;
  uVar23 = uVar23 + iVar9 + 0x5c4dd124 + ((~uVar22 | uVar26) ^ uVar28);
  uVar23 = uVar23 * 0x800 | uVar23 >> 0x15;
  uVar28 = uVar28 + iVar19 + 0x5c4dd124 + ((~uVar26 | uVar23) ^ uVar22);
  uVar28 = uVar28 * 0x80 | uVar28 >> 0x19;
  uVar22 = uVar22 + iVar20 + 0x5c4dd124 + ((~uVar23 | uVar28) ^ uVar26);
  uVar22 = uVar22 * 0x80 | uVar22 >> 0x19;
  uVar26 = uVar26 + iVar16 + 0x5c4dd124 + ((~uVar28 | uVar22) ^ uVar23);
  uVar26 = uVar26 * 0x1000 | uVar26 >> 0x14;
  uVar23 = uVar23 + iVar13 + 0x5c4dd124 + ((~uVar22 | uVar26) ^ uVar28);
  uVar23 = uVar23 * 0x80 | uVar23 >> 0x19;
  uVar28 = uVar28 + iVar10 + 0x5c4dd124 + ((~uVar26 | uVar23) ^ uVar22);
  uVar28 = uVar28 * 0x40 | uVar28 >> 0x1a;
  uVar22 = uVar22 + iVar17 + 0x5c4dd124 + ((~uVar23 | uVar28) ^ uVar26);
  uVar22 = uVar22 * 0x8000 | uVar22 >> 0x11;
  uVar26 = uVar26 + iVar6 + 0x5c4dd124 + ((~uVar28 | uVar22) ^ uVar23);
  uVar26 = uVar26 * 0x2000 | uVar26 >> 0x13;
  uVar23 = uVar23 + iVar7 + 0x5c4dd124 + ((~uVar22 | uVar26) ^ uVar28);
  uVar23 = uVar23 * 0x800 | uVar23 >> 0x15;
  uVar28 = uVar28 + iVar20 + 0x6d703ef3 + (~uVar23 & uVar22 | uVar23 & uVar26);
  uVar28 = uVar28 * 0x200 | uVar28 >> 0x17;
  uVar22 = uVar22 + iVar14 + 0x6d703ef3 + (~uVar28 & uVar26 | uVar28 & uVar23);
  uVar22 = uVar22 * 0x80 | uVar22 >> 0x19;
  uVar26 = uVar26 + iVar6 + 0x6d703ef3 + (~uVar22 & uVar23 | uVar22 & uVar28);
  uVar26 = uVar26 * 0x8000 | uVar26 >> 0x11;
  uVar23 = uVar23 + iVar8 + 0x6d703ef3 + (~uVar26 & uVar28 | uVar26 & uVar22);
  uVar23 = uVar23 * 0x800 | uVar23 >> 0x15;
  uVar28 = uVar28 + iVar15 + 0x6d703ef3 + (~uVar23 & uVar22 | uVar23 & uVar26);
  uVar28 = uVar28 * 0x100 | uVar28 >> 0x18;
  uVar22 = uVar22 + iVar19 + 0x6d703ef3 + (~uVar28 & uVar26 | uVar28 & uVar23);
  uVar22 = uVar22 * 0x40 | uVar22 >> 0x1a;
  uVar26 = uVar26 + iVar12 + 0x6d703ef3 + (~uVar22 & uVar23 | uVar22 & uVar28);
  uVar26 = uVar26 * 0x40 | uVar26 >> 0x1a;
  uVar23 = uVar23 + iVar17 + 0x6d703ef3 + (~uVar26 & uVar28 | uVar26 & uVar22);
  uVar23 = uVar23 * 0x4000 | uVar23 >> 0x12;
  uVar28 = uVar28 + iVar18 + 0x6d703ef3 + (~uVar23 & uVar22 | uVar23 & uVar26);
  uVar28 = uVar28 * 0x1000 | uVar28 >> 0x14;
  uVar22 = uVar22 + iVar16 + 0x6d703ef3 + (~uVar28 & uVar26 | uVar28 & uVar23);
  uVar22 = uVar22 * 0x2000 | uVar22 >> 0x13;
  uVar26 = uVar26 + iVar13 + 0x6d703ef3 + (~uVar22 & uVar23 | uVar22 & uVar28);
  uVar26 = uVar26 * 0x20 | uVar26 >> 0x1b;
  uVar23 = uVar23 + iVar7 + 0x6d703ef3 + (~uVar26 & uVar28 | uVar26 & uVar22);
  uVar23 = uVar23 * 0x4000 | uVar23 >> 0x12;
  uVar28 = uVar28 + iVar9 + 0x6d703ef3 + (~uVar23 & uVar22 | uVar23 & uVar26);
  uVar28 = uVar28 * 0x2000 | uVar28 >> 0x13;
  uVar22 = uVar22 + iVar3 + 0x6d703ef3 + (~uVar28 & uVar26 | uVar28 & uVar23);
  uVar22 = uVar22 * 0x2000 | uVar22 >> 0x13;
  uVar26 = uVar26 + iVar10 + 0x6d703ef3 + (~uVar22 & uVar23 | uVar22 & uVar28);
  uVar26 = uVar26 * 0x80 | uVar26 >> 0x19;
  uVar23 = uVar23 + iVar11 + 0x6d703ef3 + (~uVar26 & uVar28 | uVar26 & uVar22);
  uVar23 = uVar23 * 0x20 | uVar23 >> 0x1b;
  uVar28 = uVar28 + iVar16 + (uVar23 ^ uVar26 ^ uVar22);
  uVar28 = uVar28 * 0x8000 | uVar28 >> 0x11;
  uVar22 = uVar22 + iVar12 + (uVar23 ^ uVar26 ^ uVar28);
  uVar22 = uVar22 * 0x20 | uVar22 >> 0x1b;
  uVar26 = uVar26 + iVar10 + (uVar28 ^ uVar23 ^ uVar22);
  uVar26 = uVar26 * 0x100 | uVar26 >> 0x18;
  uVar23 = uVar23 + iVar6 + (uVar22 ^ uVar28 ^ uVar26);
  uVar23 = uVar23 * 0x800 | uVar23 >> 0x15;
  uVar28 = uVar28 + iVar8 + (uVar26 ^ uVar22 ^ uVar23);
  uVar28 = uVar28 * 0x4000 | uVar28 >> 0x12;
  uVar22 = uVar22 + iVar18 + (uVar23 ^ uVar26 ^ uVar28);
  uVar22 = uVar22 * 0x4000 | uVar22 >> 0x12;
  uVar26 = uVar26 + iVar20 + (uVar28 ^ uVar23 ^ uVar22);
  uVar26 = uVar26 * 0x40 | uVar26 >> 0x1a;
  uVar23 = uVar23 + iVar3 + (uVar22 ^ uVar28 ^ uVar26);
  uVar23 = uVar23 * 0x4000 | uVar23 >> 0x12;
  uVar28 = uVar28 + iVar14 + (uVar26 ^ uVar22 ^ uVar23);
  uVar21 = uVar28 * 0x40 | uVar28 >> 0x1a;
  uVar22 = uVar22 + iVar13 + (uVar23 ^ uVar26 ^ uVar21);
  uVar22 = uVar22 * 0x200 | uVar22 >> 0x17;
  uVar26 = uVar26 + iVar7 + (uVar21 ^ uVar23 ^ uVar22);
  uVar28 = uVar26 * 0x1000 | uVar26 >> 0x14;
  uVar23 = uVar23 + iVar11 + (uVar22 ^ uVar21 ^ uVar28);
  uVar26 = uVar23 * 0x200 | uVar23 >> 0x17;
  uVar23 = uVar21 + iVar17 + (uVar28 ^ uVar22 ^ uVar26);
  uVar21 = uVar23 * 0x1000 | uVar23 >> 0x14;
  uVar22 = uVar22 + iVar15 + (uVar26 ^ uVar28 ^ uVar21);
  uVar22 = uVar22 * 0x20 | uVar22 >> 0x1b;
  uVar23 = uVar28 + iVar9 + (uVar21 ^ uVar26 ^ uVar22);
  uVar28 = uVar23 * 0x8000 | uVar23 >> 0x11;
  uVar23 = uVar22 ^ uVar21 ^ uVar28;
  uVar26 = uVar26 + iVar19 + uVar23;
  (md->rmd128).state[1] = uVar21 + uVar1 + uVar27;
  (md->rmd128).state[2] = uVar24 + uVar5 + (uVar26 * 0x100 | uVar26 >> 0x18);
  (md->rmd128).state[3] = uVar28 + uVar4 + (uVar25 * 0x1000 | uVar25 >> 0x14);
  (md->rmd128).state[0] = uVar2 + uVar22 + uVar29;
  return uVar23;
}

Assistant:

static int  rmd128_compress(hash_state *md, unsigned char *buf)
#endif
{
   ulong32 aa,bb,cc,dd,aaa,bbb,ccc,ddd,X[16];
   int i;

   /* load words X */
   for (i = 0; i < 16; i++){
      LOAD32L(X[i], buf + (4 * i));
   }

   /* load state */
   aa = aaa = md->rmd128.state[0];
   bb = bbb = md->rmd128.state[1];
   cc = ccc = md->rmd128.state[2];
   dd = ddd = md->rmd128.state[3];

   /* round 1 */
   FF(aa, bb, cc, dd, X[ 0], 11);
   FF(dd, aa, bb, cc, X[ 1], 14);
   FF(cc, dd, aa, bb, X[ 2], 15);
   FF(bb, cc, dd, aa, X[ 3], 12);
   FF(aa, bb, cc, dd, X[ 4],  5);
   FF(dd, aa, bb, cc, X[ 5],  8);
   FF(cc, dd, aa, bb, X[ 6],  7);
   FF(bb, cc, dd, aa, X[ 7],  9);
   FF(aa, bb, cc, dd, X[ 8], 11);
   FF(dd, aa, bb, cc, X[ 9], 13);
   FF(cc, dd, aa, bb, X[10], 14);
   FF(bb, cc, dd, aa, X[11], 15);
   FF(aa, bb, cc, dd, X[12],  6);
   FF(dd, aa, bb, cc, X[13],  7);
   FF(cc, dd, aa, bb, X[14],  9);
   FF(bb, cc, dd, aa, X[15],  8);

   /* round 2 */
   GG(aa, bb, cc, dd, X[ 7],  7);
   GG(dd, aa, bb, cc, X[ 4],  6);
   GG(cc, dd, aa, bb, X[13],  8);
   GG(bb, cc, dd, aa, X[ 1], 13);
   GG(aa, bb, cc, dd, X[10], 11);
   GG(dd, aa, bb, cc, X[ 6],  9);
   GG(cc, dd, aa, bb, X[15],  7);
   GG(bb, cc, dd, aa, X[ 3], 15);
   GG(aa, bb, cc, dd, X[12],  7);
   GG(dd, aa, bb, cc, X[ 0], 12);
   GG(cc, dd, aa, bb, X[ 9], 15);
   GG(bb, cc, dd, aa, X[ 5],  9);
   GG(aa, bb, cc, dd, X[ 2], 11);
   GG(dd, aa, bb, cc, X[14],  7);
   GG(cc, dd, aa, bb, X[11], 13);
   GG(bb, cc, dd, aa, X[ 8], 12);

   /* round 3 */
   HH(aa, bb, cc, dd, X[ 3], 11);
   HH(dd, aa, bb, cc, X[10], 13);
   HH(cc, dd, aa, bb, X[14],  6);
   HH(bb, cc, dd, aa, X[ 4],  7);
   HH(aa, bb, cc, dd, X[ 9], 14);
   HH(dd, aa, bb, cc, X[15],  9);
   HH(cc, dd, aa, bb, X[ 8], 13);
   HH(bb, cc, dd, aa, X[ 1], 15);
   HH(aa, bb, cc, dd, X[ 2], 14);
   HH(dd, aa, bb, cc, X[ 7],  8);
   HH(cc, dd, aa, bb, X[ 0], 13);
   HH(bb, cc, dd, aa, X[ 6],  6);
   HH(aa, bb, cc, dd, X[13],  5);
   HH(dd, aa, bb, cc, X[11], 12);
   HH(cc, dd, aa, bb, X[ 5],  7);
   HH(bb, cc, dd, aa, X[12],  5);

   /* round 4 */
   II(aa, bb, cc, dd, X[ 1], 11);
   II(dd, aa, bb, cc, X[ 9], 12);
   II(cc, dd, aa, bb, X[11], 14);
   II(bb, cc, dd, aa, X[10], 15);
   II(aa, bb, cc, dd, X[ 0], 14);
   II(dd, aa, bb, cc, X[ 8], 15);
   II(cc, dd, aa, bb, X[12],  9);
   II(bb, cc, dd, aa, X[ 4],  8);
   II(aa, bb, cc, dd, X[13],  9);
   II(dd, aa, bb, cc, X[ 3], 14);
   II(cc, dd, aa, bb, X[ 7],  5);
   II(bb, cc, dd, aa, X[15],  6);
   II(aa, bb, cc, dd, X[14],  8);
   II(dd, aa, bb, cc, X[ 5],  6);
   II(cc, dd, aa, bb, X[ 6],  5);
   II(bb, cc, dd, aa, X[ 2], 12);

   /* parallel round 1 */
   III(aaa, bbb, ccc, ddd, X[ 5],  8);
   III(ddd, aaa, bbb, ccc, X[14],  9);
   III(ccc, ddd, aaa, bbb, X[ 7],  9);
   III(bbb, ccc, ddd, aaa, X[ 0], 11);
   III(aaa, bbb, ccc, ddd, X[ 9], 13);
   III(ddd, aaa, bbb, ccc, X[ 2], 15);
   III(ccc, ddd, aaa, bbb, X[11], 15);
   III(bbb, ccc, ddd, aaa, X[ 4],  5);
   III(aaa, bbb, ccc, ddd, X[13],  7);
   III(ddd, aaa, bbb, ccc, X[ 6],  7);
   III(ccc, ddd, aaa, bbb, X[15],  8);
   III(bbb, ccc, ddd, aaa, X[ 8], 11);
   III(aaa, bbb, ccc, ddd, X[ 1], 14);
   III(ddd, aaa, bbb, ccc, X[10], 14);
   III(ccc, ddd, aaa, bbb, X[ 3], 12);
   III(bbb, ccc, ddd, aaa, X[12],  6);

   /* parallel round 2 */
   HHH(aaa, bbb, ccc, ddd, X[ 6],  9);
   HHH(ddd, aaa, bbb, ccc, X[11], 13);
   HHH(ccc, ddd, aaa, bbb, X[ 3], 15);
   HHH(bbb, ccc, ddd, aaa, X[ 7],  7);
   HHH(aaa, bbb, ccc, ddd, X[ 0], 12);
   HHH(ddd, aaa, bbb, ccc, X[13],  8);
   HHH(ccc, ddd, aaa, bbb, X[ 5],  9);
   HHH(bbb, ccc, ddd, aaa, X[10], 11);
   HHH(aaa, bbb, ccc, ddd, X[14],  7);
   HHH(ddd, aaa, bbb, ccc, X[15],  7);
   HHH(ccc, ddd, aaa, bbb, X[ 8], 12);
   HHH(bbb, ccc, ddd, aaa, X[12],  7);
   HHH(aaa, bbb, ccc, ddd, X[ 4],  6);
   HHH(ddd, aaa, bbb, ccc, X[ 9], 15);
   HHH(ccc, ddd, aaa, bbb, X[ 1], 13);
   HHH(bbb, ccc, ddd, aaa, X[ 2], 11);

   /* parallel round 3 */
   GGG(aaa, bbb, ccc, ddd, X[15],  9);
   GGG(ddd, aaa, bbb, ccc, X[ 5],  7);
   GGG(ccc, ddd, aaa, bbb, X[ 1], 15);
   GGG(bbb, ccc, ddd, aaa, X[ 3], 11);
   GGG(aaa, bbb, ccc, ddd, X[ 7],  8);
   GGG(ddd, aaa, bbb, ccc, X[14],  6);
   GGG(ccc, ddd, aaa, bbb, X[ 6],  6);
   GGG(bbb, ccc, ddd, aaa, X[ 9], 14);
   GGG(aaa, bbb, ccc, ddd, X[11], 12);
   GGG(ddd, aaa, bbb, ccc, X[ 8], 13);
   GGG(ccc, ddd, aaa, bbb, X[12],  5);
   GGG(bbb, ccc, ddd, aaa, X[ 2], 14);
   GGG(aaa, bbb, ccc, ddd, X[10], 13);
   GGG(ddd, aaa, bbb, ccc, X[ 0], 13);
   GGG(ccc, ddd, aaa, bbb, X[ 4],  7);
   GGG(bbb, ccc, ddd, aaa, X[13],  5);

   /* parallel round 4 */
   FFF(aaa, bbb, ccc, ddd, X[ 8], 15);
   FFF(ddd, aaa, bbb, ccc, X[ 6],  5);
   FFF(ccc, ddd, aaa, bbb, X[ 4],  8);
   FFF(bbb, ccc, ddd, aaa, X[ 1], 11);
   FFF(aaa, bbb, ccc, ddd, X[ 3], 14);
   FFF(ddd, aaa, bbb, ccc, X[11], 14);
   FFF(ccc, ddd, aaa, bbb, X[15],  6);
   FFF(bbb, ccc, ddd, aaa, X[ 0], 14);
   FFF(aaa, bbb, ccc, ddd, X[ 5],  6);
   FFF(ddd, aaa, bbb, ccc, X[12],  9);
   FFF(ccc, ddd, aaa, bbb, X[ 2], 12);
   FFF(bbb, ccc, ddd, aaa, X[13],  9);
   FFF(aaa, bbb, ccc, ddd, X[ 9], 12);
   FFF(ddd, aaa, bbb, ccc, X[ 7],  5);
   FFF(ccc, ddd, aaa, bbb, X[10], 15);
   FFF(bbb, ccc, ddd, aaa, X[14],  8);

   /* combine results */
   ddd += cc + md->rmd128.state[1];               /* final result for MDbuf[0] */
   md->rmd128.state[1] = md->rmd128.state[2] + dd + aaa;
   md->rmd128.state[2] = md->rmd128.state[3] + aa + bbb;
   md->rmd128.state[3] = md->rmd128.state[0] + bb + ccc;
   md->rmd128.state[0] = ddd;

   return CRYPT_OK;
}